

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O3

int32 rw::getSizeMaterialMatFX(void *object,int32 offset,int32 param_3)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  uint32 uVar5;
  long lVar6;
  int32 iVar7;
  bool bVar8;
  Texture *this;
  
  lVar3 = *(long *)((long)object + (long)offset);
  if (lVar3 == 0) {
    iVar7 = -1;
  }
  else {
    iVar7 = 0xc;
    lVar6 = 0;
    bVar4 = true;
    do {
      bVar8 = bVar4;
      piVar1 = (int *)(lVar3 + lVar6 * 0x28);
      iVar2 = *piVar1;
      if (iVar2 == 4) {
        this = *(Texture **)(piVar1 + 2);
LAB_001302c0:
        if (this == (Texture *)0x0) {
          iVar7 = iVar7 + 0xc;
        }
        else {
          uVar5 = Texture::streamGetSize(this);
          iVar7 = iVar7 + uVar5 + 0x18;
        }
      }
      else {
        if (iVar2 == 2) {
          this = *(Texture **)(piVar1 + 4);
          goto LAB_001302c0;
        }
        if (iVar2 == 1) {
          if (*(Texture **)(piVar1 + 4) == (Texture *)0x0) {
            iVar7 = iVar7 + 0xc;
          }
          else {
            uVar5 = Texture::streamGetSize(*(Texture **)(piVar1 + 4));
            iVar7 = iVar7 + uVar5 + 0x18;
          }
          if (*(Texture **)(piVar1 + 6) != (Texture *)0x0) {
            uVar5 = Texture::streamGetSize(*(Texture **)(piVar1 + 6));
            iVar7 = iVar7 + uVar5 + 0xc;
          }
        }
      }
      lVar6 = 1;
      bVar4 = false;
    } while (bVar8);
  }
  return iVar7;
}

Assistant:

static int32
getSizeMaterialMatFX(void *object, int32 offset, int32)
{
	MatFX *matfx = *PLUGINOFFSET(MatFX*, object, offset);
	if(matfx == nil)
		return -1;
	int32 size = 4 + 4 + 4;

	for(int i = 0; i < 2; i++){
		switch(matfx->fx[i].type){
		case MatFX::BUMPMAP:
			size += 4 + 4 + 4;
			if(matfx->fx[i].bump.bumpedTex)
				size += 12 +
				  matfx->fx[i].bump.bumpedTex->streamGetSize();
			if(matfx->fx[i].bump.tex)
				size += 12 +
				  matfx->fx[i].bump.tex->streamGetSize();
			break;

		case MatFX::ENVMAP:
			size += 4 + 4 + 4;
			if(matfx->fx[i].env.tex)
				size += 12 +
				  matfx->fx[i].env.tex->streamGetSize();
			break;

		case MatFX::DUAL:
			size += 4 + 4 + 4;
			if(matfx->fx[i].dual.tex)
				size += 12 +
				  matfx->fx[i].dual.tex->streamGetSize();
			break;
		}
	}
	return size;
}